

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::anon_unknown_35::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  PathPtr path_00;
  Impl *pIVar1;
  undefined1 uVar2;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  size_t sVar4;
  String *pSVar5;
  char *pcVar6;
  StringPtr name;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Path newPath;
  
  sVar4 = path.parts.size_;
  pSVar5 = path.parts.ptr;
  if (sVar4 == 0) {
    uVar2 = 1;
  }
  else if (sVar4 == 1) {
    kj::_::Mutex::lock(&(this->impl).mutex,SHARED);
    lock.ptr = &(this->impl).value;
    sVar4 = (pSVar5->content).size_;
    if (sVar4 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar5->content).ptr;
    }
    name.content.size_ = sVar4 + (sVar4 == 0);
    name.content.ptr = pcVar6;
    lock.mutex = &(this->impl).mutex;
    MVar3 = Impl::tryGetEntry(lock.ptr,name);
    if (MVar3.ptr == (EntryImpl *)0x0) {
      uVar2 = false;
    }
    else {
      uVar2 = true;
      if (((MVar3.ptr)->node).tag == 3) {
        SymlinkNode::parse(&newPath,(SymlinkNode *)&((MVar3.ptr)->node).field_1);
        Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release(&lock);
        path_00.parts.size_ = newPath.parts.size_;
        path_00.parts.ptr = newPath.parts.ptr;
        uVar2 = exists(this,path_00);
        Array<kj::String>::~Array(&newPath.parts);
      }
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
  }
  else {
    if ((pSVar5->content).size_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pSVar5->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar6;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&lock,name_00);
    pIVar1 = lock.ptr;
    newPath.parts.ptr = (String *)lock.mutex;
    newPath.parts.size_ = (size_t)lock.ptr;
    lock.ptr = (Impl *)0x0;
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&lock);
    if (pIVar1 == (Impl *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (**(code **)(pIVar1->clock + 0x40))(pIVar1,pSVar5 + 1,sVar4 - 1);
    }
    Own<const_kj::ReadableDirectory>::dispose((Own<const_kj::ReadableDirectory> *)&newPath);
  }
  return (bool)uVar2;
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_MAYBE(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, *entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(subdir, tryGetParent(path[0])) {
        return subdir->get()->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }